

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_singleton.c
# Opt level: O2

log_singleton log_singleton_instance_impl(void)

{
  int iVar1;
  log_singleton __ptr;
  log_map plVar2;
  
  if (log_singleton_instance::s != (log_singleton)0x0) {
    return log_singleton_instance::s;
  }
  __ptr = (log_singleton)malloc(8);
  if (__ptr != (log_singleton)0x0) {
    plVar2 = log_map_create(0x200);
    __ptr->map = plVar2;
    if (plVar2 != (log_map)0x0) {
      log_singleton_instance::s = __ptr;
      portability_atexit_initialize();
      iVar1 = portability_atexit_register(log_atexit_callback);
      if (iVar1 == 0) {
        return log_singleton_instance::s;
      }
      log_singleton_destroy();
      abort();
    }
    free(__ptr);
  }
  log_singleton_instance::s = (log_singleton)0x0;
  abort();
}

Assistant:

log_singleton log_singleton_instance_impl(void)
{
	log_singleton *singleton_ptr = log_singleton_instance();

	if (*singleton_ptr == NULL)
	{
		*singleton_ptr = log_singleton_create();

		if (*singleton_ptr == NULL)
		{
			abort();
		}

		/* Initialize at exit handlers */
		portability_atexit_initialize();

		if (portability_atexit_register(&log_atexit_callback) != 0)
		{
			if (log_singleton_destroy() != 0)
			{
				/* ... */
			}

			abort();
		}
	}

	return *singleton_ptr;
}